

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O1

void mime_subparts_free(void *ptr)

{
  curl_mimepart *part;
  long lVar1;
  curl_mime *mime;
  
  if ((ptr != (void *)0x0) && (lVar1 = *(long *)((long)ptr + 8), lVar1 != 0)) {
    *(undefined8 *)(lVar1 + 0x28) = 0;
    *(undefined8 *)(lVar1 + 0x30) = 0;
    *(undefined8 *)(lVar1 + 0x38) = 0;
    *(long *)(lVar1 + 0x40) = lVar1;
    *(undefined8 *)(lVar1 + 0x20) = 0;
    *(undefined8 *)(lVar1 + 0x48) = 0;
    *(undefined8 *)(lVar1 + 0x78) = 0;
    *(undefined8 *)(lVar1 + 0xa8) = 0;
    *(undefined8 *)(lVar1 + 0xb0) = 0;
    *(undefined8 *)(lVar1 + 0xb8) = 0;
    *(undefined4 *)(lVar1 + 0x18) = 0;
    curl_mime_free((curl_mime *)ptr);
    return;
  }
  if (ptr != (void *)0x0) {
    lVar1 = *(long *)((long)ptr + 8);
    if (lVar1 != 0) {
      *(undefined8 *)(lVar1 + 0x28) = 0;
      *(undefined8 *)(lVar1 + 0x30) = 0;
      *(undefined8 *)(lVar1 + 0x38) = 0;
      *(long *)(lVar1 + 0x40) = lVar1;
      *(undefined8 *)(lVar1 + 0x20) = 0;
      *(undefined8 *)(lVar1 + 0x48) = 0;
      *(undefined8 *)(lVar1 + 0x78) = 0;
      *(undefined8 *)(lVar1 + 0xa8) = 0;
      *(undefined8 *)(lVar1 + 0xb0) = 0;
      *(undefined8 *)(lVar1 + 0xb8) = 0;
      *(undefined4 *)(lVar1 + 0x18) = 0;
      *(undefined8 *)((long)ptr + 8) = 0;
    }
    part = *(curl_mimepart **)((long)ptr + 0x10);
    while (part != (curl_mimepart *)0x0) {
      *(curl_mimepart **)((long)ptr + 0x10) = part->nextpart;
      Curl_mime_cleanpart(part);
      (*Curl_cfree)(part);
      part = *(curl_mimepart **)((long)ptr + 0x10);
    }
    (*Curl_cfree)(ptr);
    return;
  }
  return;
}

Assistant:

static void mime_subparts_free(void *ptr)
{
  curl_mime *mime = (curl_mime *) ptr;

  if(mime && mime->parent) {
    mime->parent->freefunc = NULL;  /* Be sure we won't be called again. */
    cleanup_part_content(mime->parent);  /* Avoid dangling pointer in part. */
  }
  curl_mime_free(mime);
}